

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

int __thiscall QString::remove(QString *this,char *__filename)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype size;
  char16_t *pcVar3;
  qsizetype qVar4;
  iterator pQVar5;
  iterator __result;
  CaseSensitivity in_ECX;
  char *in_RDX;
  __off_t extraout_RDX;
  __off_t extraout_RDX_00;
  __off_t extraout_RDX_01;
  __off_t __length;
  size_t __n;
  char16_t *__src;
  char16_t *pcVar6;
  char16_t *pcVar7;
  long in_FS_OFFSET;
  QLatin1StringView str;
  QLatin1StringView str_00;
  QLatin1StringView str_01;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((__filename != (char *)0x0) &&
     (str.m_data = in_RDX, str.m_size = (qsizetype)__filename, qVar4 = indexOf(this,str,0,in_ECX),
     -1 < qVar4)) {
    pDVar1 = (this->d).d;
    pcVar2 = (this->d).ptr;
    size = (this->d).size;
    pcVar3 = pcVar2 + size;
    if ((pDVar1 == (Data *)0x0) ||
       (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QString((QString *)&local_58,size,Uninitialized);
      pQVar5 = begin((QString *)&local_58);
      __result = pQVar5;
      pcVar7 = pcVar2 + qVar4;
      pcVar6 = pcVar2;
      while( true ) {
        __result = std::__copy_move<false,false,std::random_access_iterator_tag>::
                   __copy_m<char16_t*,QChar*>(pcVar6,pcVar7,__result);
        pcVar6 = pcVar7 + (long)__filename;
        if (pcVar3 <= pcVar6) break;
        str_00.m_data = in_RDX;
        str_00.m_size = (qsizetype)__filename;
        qVar4 = indexOf(this,str_00,(long)pcVar6 - (long)pcVar2 >> 1,in_ECX);
        pcVar7 = pcVar2 + qVar4;
        if (qVar4 == -1) {
          pcVar7 = pcVar3;
        }
      }
      resize((QString *)&local_58,(long)__result - (long)pQVar5 >> 1);
      pDVar1 = (this->d).d;
      pcVar3 = (this->d).ptr;
      (this->d).d = local_58.d;
      (this->d).ptr = local_58.ptr;
      qVar4 = (this->d).size;
      (this->d).size = local_58.size;
      local_58.d = pDVar1;
      local_58.ptr = pcVar3;
      local_58.size = qVar4;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    }
    else {
      pcVar7 = pcVar2 + qVar4;
      __length = extraout_RDX;
      pcVar6 = pcVar7;
      while (__src = pcVar6 + (long)__filename, __src < pcVar3) {
        str_01.m_data = in_RDX;
        str_01.m_size = (qsizetype)__filename;
        qVar4 = indexOf(this,str_01,(long)__src - (long)pcVar2 >> 1,in_ECX);
        pcVar6 = pcVar2 + qVar4;
        if (qVar4 == -1) {
          pcVar6 = pcVar3;
        }
        __n = (long)pcVar6 - (long)__src;
        __length = extraout_RDX_00;
        if (__n != 0) {
          memmove(pcVar7,__src,__n);
          __length = extraout_RDX_01;
        }
        pcVar7 = (char16_t *)((long)pcVar7 + __n);
      }
      truncate(this,(char *)((long)pcVar7 - (long)pcVar2 >> 1),__length);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (int)this;
}

Assistant:

QString &QString::remove(QLatin1StringView str, Qt::CaseSensitivity cs)
{
    removeStringImpl(*this, str, cs);
    return *this;
}